

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O0

void __thiscall Fl_Plugin_Manager::Fl_Plugin_Manager(Fl_Plugin_Manager *this,char *klass)

{
  char *group;
  Name local_20;
  char *local_18;
  char *klass_local;
  Fl_Plugin_Manager *this_local;
  
  local_18 = klass;
  klass_local = (char *)this;
  Fl_Preferences::Name::Name(&local_20,"%s/%s","plugins",klass);
  group = Fl_Preferences::Name::operator_cast_to_char_(&local_20);
  Fl_Preferences::Fl_Preferences(&this->super_Fl_Preferences,(Fl_Preferences *)0x0,group);
  Fl_Preferences::Name::~Name(&local_20);
  (this->super_Fl_Preferences)._vptr_Fl_Preferences = (_func_int **)&PTR__Fl_Plugin_Manager_002e4920
  ;
  return;
}

Assistant:

Fl_Plugin_Manager::Fl_Plugin_Manager(const char *klass)
: Fl_Preferences(0, Fl_Preferences::Name("%s/%s", "plugins", klass)) {
#ifdef FL_PLUGIN_VERBOSE
  printf("Fl_Plugin: creating a plugin manager for class \"%s\"\n", klass);
#endif
}